

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int cvSensRhsWrapper(CVodeMem cv_mem,sunrealtype time,N_Vector ycur,N_Vector fcur,N_Vector *yScur,
                    N_Vector *fScur,N_Vector temp1,N_Vector temp2)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (cv_mem->cv_ifS == 2) {
    iVar1 = (*cv_mem->cv_fS)(cv_mem->cv_Ns,time,ycur,fcur,yScur,fScur,cv_mem->cv_fS_data,temp1,temp2
                            );
    cv_mem->cv_nfSe = cv_mem->cv_nfSe + 1;
  }
  else {
    uVar3 = (ulong)(uint)cv_mem->cv_Ns;
    if (0 < cv_mem->cv_Ns) {
      lVar2 = 0;
      do {
        iVar1 = (*cv_mem->cv_fS1)((int)uVar3,time,ycur,fcur,(int)lVar2,yScur[lVar2],fScur[lVar2],
                                  cv_mem->cv_fS_data,temp1,temp2);
        cv_mem->cv_nfSe = cv_mem->cv_nfSe + 1;
        if (iVar1 != 0) {
          return iVar1;
        }
        lVar2 = lVar2 + 1;
        uVar3 = (ulong)cv_mem->cv_Ns;
      } while (lVar2 < (long)uVar3);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cvSensRhsWrapper(CVodeMem cv_mem, sunrealtype time, N_Vector ycur,
                     N_Vector fcur, N_Vector* yScur, N_Vector* fScur,
                     N_Vector temp1, N_Vector temp2)
{
  int retval = 0, is;

  if (cv_mem->cv_ifS == CV_ALLSENS)
  {
    retval = cv_mem->cv_fS(cv_mem->cv_Ns, time, ycur, fcur, yScur, fScur,
                           cv_mem->cv_fS_data, temp1, temp2);
    cv_mem->cv_nfSe++;
  }
  else
  {
    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      retval = cv_mem->cv_fS1(cv_mem->cv_Ns, time, ycur, fcur, is, yScur[is],
                              fScur[is], cv_mem->cv_fS_data, temp1, temp2);
      cv_mem->cv_nfSe++;
      if (retval != 0) { break; }
    }
  }

  return (retval);
}